

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O1

Token * MyCompiler::nextToken(Token *__return_storage_ptr__,istream *stream)

{
  SymbolType symbolType;
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Token *pTVar9;
  __node_base_ptr p_Var10;
  mapped_type *pmVar11;
  __node_ptr p_Var12;
  LexicalError *this;
  size_type in_RCX;
  __hash_code __code;
  __hash_code __c;
  long lVar13;
  size_type extraout_RDX;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
  *puVar14;
  undefined4 *puVar15;
  unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
  *puVar16;
  _Alloc_hider _Var17;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  *ppVar18;
  hasher *in_R8;
  key_equal *in_R9;
  __node_base_ptr p_Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  byte bVar21;
  initializer_list<std::pair<const_char,_State>_> __l;
  pos_type offset;
  undefined1 auVar22 [16];
  char c;
  string buffer;
  allocator_type *in_stack_fffffffffffffc68;
  SymbolType local_390;
  allocator_type local_38b;
  key_equal local_38a;
  hasher local_389;
  SymbolType local_388;
  SymbolType local_384 [11];
  string local_358 [6];
  string local_298;
  string local_278;
  string local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_58;
  
  bVar21 = 0;
  puVar16 = (unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
             *)stream;
  if ((nextToken(std::istream&)::keywordsMap_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&nextToken(std::istream&)::keywordsMap_abi_cxx11_), iVar8 != 0)) {
    local_390 = BEGIN;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_238,(char (*) [6])"begin",&local_390);
    local_384[0] = END;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_210,(char (*) [4])"end",local_384);
    local_388 = IF;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_1e8,(char (*) [3])"if",&local_388);
    local_384[10] = 0x16;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_1c0,(char (*) [5])"then",local_384 + 10);
    local_384[9] = 0x17;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_198,(char (*) [6])"while",local_384 + 9);
    local_384[8] = 0x18;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_170,(char (*) [6])"write",local_384 + 8);
    local_384[7] = 0x19;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_148,(char (*) [5])"read",local_384 + 7);
    local_384[6] = 0x1a;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_120,(char (*) [3])"do",local_384 + 6);
    local_384[5] = 0x1b;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_f8,(char (*) [5])"call",local_384 + 5);
    local_384[4] = 0x1c;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_d0,(char (*) [6])"const",local_384 + 4);
    local_384[3] = 0x1d;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_a8,(char (*) [4])"var",local_384 + 3);
    local_384[2] = 0x1e;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[10],_MyCompiler::SymbolType,_true>
              (&local_80,(char (*) [10])"procedure",local_384 + 2);
    local_384[1] = 0x1f;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_58,(char (*) [4])"odd",local_384 + 1);
    in_stack_fffffffffffffc68 = &local_38b;
    in_R8 = &local_389;
    in_R9 = &local_38a;
    in_RCX = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&local_238,
               &stack0xffffffffffffffd0);
    lVar13 = -0x208;
    paVar20 = &local_58.first.field_2;
    do {
      if (paVar20 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar20->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar20->_M_allocated_capacity)[-2],
                        paVar20->_M_allocated_capacity + 1);
      }
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar20->_M_allocated_capacity + -5);
      lVar13 = lVar13 + 0x28;
    } while (lVar13 != 0);
    puVar14 = &nextToken(std::istream&)::keywordsMap_abi_cxx11_;
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::keywordsMap_abi_cxx11_);
    puVar16 = (unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
               *)puVar14;
  }
  if ((nextToken(std::istream&)::startCharsSymbolTypeMap == '\0') &&
     (iVar8 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsSymbolTypeMap), iVar8 != 0))
  {
    puVar15 = &DAT_0010d9dc;
    ppVar18 = &local_238;
    for (lVar13 = 0x16; lVar13 != 0; lVar13 = lVar13 + -1) {
      *(undefined4 *)&(ppVar18->first)._M_dataplus._M_p = *puVar15;
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      ppVar18 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
                 *)((long)ppVar18 + (ulong)bVar21 * -8 + 4);
    }
    in_stack_fffffffffffffc68 = (allocator_type *)&local_388;
    in_R8 = (hasher *)&local_390;
    in_R9 = (key_equal *)local_384;
    in_RCX = 0;
    std::
    _Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<char_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&nextToken::startCharsSymbolTypeMap,&local_238,&local_1e8.first._M_string_length);
    puVar16 = &nextToken::startCharsSymbolTypeMap;
    __cxa_atexit(std::
                 unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken::startCharsSymbolTypeMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsSymbolTypeMap);
  }
  if ((nextToken(std::istream&)::startCharsStateMap == '\0') &&
     (iVar8 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsStateMap), iVar8 != 0)) {
    __l._M_len = extraout_RDX;
    __l._M_array = (iterator)puVar16;
    std::
    unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
    ::unordered_map((unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                     *)&DAT_0010da34,__l,in_RCX,in_R8,in_R9,in_stack_fffffffffffffc68);
    __cxa_atexit(std::
                 unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                 ::~unordered_map,&nextToken::startCharsStateMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsStateMap);
  }
  local_238.first._M_dataplus._M_p = (pointer)&local_238.first.field_2;
  local_238.first._M_string_length = 0;
  local_238.first.field_2._M_local_buf[0] = '\0';
  iVar8 = 0;
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    iVar8 = 0;
    do {
      cVar5 = (char)&local_238;
      switch(iVar8) {
      case 0:
        std::ws<char,std::char_traits<char>>(stream);
        if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) goto LAB_0010abe9;
        cVar4 = std::istream::peek();
        local_390 = CONCAT31(local_390._1_3_,cVar4);
        iVar8 = isalpha((int)cVar4);
        if (iVar8 == 0) {
          if ((int)cVar4 - 0x30U < 10) {
            std::istream::get();
            std::__cxx11::string::push_back(cVar5);
            iVar7 = 2;
            goto LAB_0010aefc;
          }
          __c = (__hash_code)cVar4;
          p_Var1 = nextToken::startCharsSymbolTypeMap._M_h._M_buckets
                   [__c % nextToken::startCharsSymbolTypeMap._M_h._M_bucket_count];
          p_Var10 = (__node_base_ptr)0x0;
          if ((p_Var1 != (__node_base_ptr)0x0) &&
             (p_Var10 = p_Var1, p_Var19 = p_Var1->_M_nxt,
             *(char *)&p_Var1->_M_nxt[1]._M_nxt != cVar4)) {
            while (p_Var2 = p_Var19->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
              p_Var10 = (__node_base_ptr)0x0;
              if (((ulong)(long)*(char *)&p_Var2[1]._M_nxt %
                   nextToken::startCharsSymbolTypeMap._M_h._M_bucket_count !=
                   __c % nextToken::startCharsSymbolTypeMap._M_h._M_bucket_count) ||
                 (p_Var10 = p_Var19, p_Var19 = p_Var2, *(char *)&p_Var2[1]._M_nxt == cVar4))
              goto LAB_0010ae29;
            }
            p_Var10 = (__node_base_ptr)0x0;
          }
LAB_0010ae29:
          if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
            p_Var12 = std::
                      _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_node((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      *)(__c % nextToken::startCharsStateMap._M_h._M_bucket_count),
                                     (size_type)&local_390,
                                     (key_type *)
                                     (__c % nextToken::startCharsStateMap._M_h._M_bucket_count),__c)
            ;
            if (p_Var12 == (__node_ptr)0x0) {
LAB_0010b522:
              this = (LexicalError *)__cxa_allocate_exception(0x20);
              auVar22 = std::istream::tellg();
              offset._M_state = auVar22._8_8_;
              offset._M_off = auVar22._0_8_ + 1;
              LexicalError::LexicalError(this,offset);
              __cxa_throw(this,&LexicalError::typeinfo,std::runtime_error::~runtime_error);
            }
            std::istream::get();
            p_Var12 = std::
                      _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::_M_find_node((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      *)((ulong)(long)(char)(undefined1)local_390 %
                                        nextToken::startCharsStateMap._M_h._M_bucket_count),
                                     (size_type)&local_390,
                                     (key_type *)
                                     ((ulong)(long)(char)(undefined1)local_390 %
                                     nextToken::startCharsStateMap._M_h._M_bucket_count),__c);
            if (p_Var12 == (__node_ptr)0x0) {
              std::__throw_out_of_range("_Map_base::at");
              goto LAB_0010b522;
            }
            iVar7 = *(int *)((long)&(p_Var12->
                                    super__Hash_node_value<std::pair<const_char,_State>,_false>).
                                    super__Hash_node_value_base<std::pair<const_char,_State>_>.
                                    _M_storage._M_storage + 4);
            goto LAB_0010aefc;
          }
          std::istream::get();
          pmVar11 = std::__detail::
                    _Map_base<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&nextToken::startCharsSymbolTypeMap,(key_type *)&local_390);
          symbolType = *pmVar11;
          local_358[0]._M_dataplus._M_p = (pointer)&local_358[0].field_2;
          std::__cxx11::string::_M_construct((ulong)local_358,'\x01');
          Token::Token(__return_storage_ptr__,symbolType,local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358[0]._M_dataplus._M_p != &local_358[0].field_2) {
            operator_delete(local_358[0]._M_dataplus._M_p,
                            local_358[0].field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
          iVar7 = 0;
        }
        else {
          std::istream::get();
          std::__cxx11::string::push_back(cVar5);
          iVar7 = 1;
LAB_0010aefc:
          bVar3 = true;
        }
        if (!bVar3) goto LAB_0010b056;
        break;
      case 1:
        cVar4 = std::istream::peek();
        iVar6 = isalnum((int)cVar4);
        if (iVar6 == 0) goto LAB_0010abe9;
        std::istream::get();
        std::__cxx11::string::push_back(cVar5);
        iVar7 = 1;
        if (iVar6 == 0) goto LAB_0010abe9;
        break;
      case 2:
        cVar4 = std::istream::peek();
        if (9 < (int)cVar4 - 0x30U) goto LAB_0010abe9;
        std::istream::get();
        std::__cxx11::string::push_back(cVar5);
        iVar7 = 2;
        if (9 < (int)cVar4 - 0x30U) goto LAB_0010abe9;
        break;
      case 3:
        cVar5 = std::istream::peek();
        if (cVar5 == '=') {
          std::istream::get();
          paVar20 = &local_258.field_2;
          local_258._M_dataplus._M_p = (pointer)paVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"<=","");
          Token::Token(__return_storage_ptr__,LEQ,&local_258);
          _Var17._M_p = local_258._M_dataplus._M_p;
          goto LAB_0010b046;
        }
        goto LAB_0010abe9;
      case 4:
        cVar5 = std::istream::peek();
        if (cVar5 == '=') {
          std::istream::get();
          paVar20 = &local_278.field_2;
          local_278._M_dataplus._M_p = (pointer)paVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,">=","");
          Token::Token(__return_storage_ptr__,GEQ,&local_278);
          _Var17._M_p = local_278._M_dataplus._M_p;
          goto LAB_0010b046;
        }
        goto LAB_0010abe9;
      default:
        cVar5 = std::istream::peek();
        if (cVar5 == '=') {
          std::istream::get();
          paVar20 = &local_298.field_2;
          local_298._M_dataplus._M_p = (pointer)paVar20;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,":=","");
          Token::Token(__return_storage_ptr__,BECOMES,&local_298);
          _Var17._M_p = local_298._M_dataplus._M_p;
LAB_0010b046:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var17._M_p != paVar20) {
            operator_delete(_Var17._M_p,paVar20->_M_allocated_capacity + 1);
          }
          goto LAB_0010b056;
        }
        goto LAB_0010abe9;
      }
      iVar8 = iVar7;
    } while (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0);
  }
LAB_0010abe9:
  if (iVar8 - 1U < 5) {
    pTVar9 = (Token *)(*(code *)(&DAT_0010d9c8 + *(int *)(&DAT_0010d9c8 + (ulong)(iVar8 - 1U) * 4)))
                                ();
    return pTVar9;
  }
  Token::Token(__return_storage_ptr__,NUL);
LAB_0010b056:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.first._M_dataplus._M_p != &local_238.first.field_2) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    CONCAT71(local_238.first.field_2._M_allocated_capacity._1_7_,
                             local_238.first.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

MyCompiler::Token MyCompiler::nextToken(std::istream &stream)
{
    enum class State
    {
        START, WORD, NUM, LT, GT, COLON
    };
    static const std::unordered_map<std::string, SymbolType> keywordsMap = {
            {"begin",     SymbolType::BEGIN},
            {"end",       SymbolType::END},
            {"if",        SymbolType::IF},
            {"then",      SymbolType::THEN},
            {"while",     SymbolType::WHILE},
            {"write",     SymbolType::WRITE},
            {"read",      SymbolType::READ},
            {"do",        SymbolType::DO},
            {"call",      SymbolType::CALL},
            {"const",     SymbolType::CONST},
            {"var",       SymbolType::VAR},
            {"procedure", SymbolType::PROC},
            {"odd",       SymbolType::ODD}
    };
    static const std::unordered_map<char, SymbolType> startCharsSymbolTypeMap = {
            {'+', SymbolType::PLUS},
            {'-', SymbolType::MINUS},
            {'*', SymbolType::TIMES},
            {'/', SymbolType::SLASH},
            {'=', SymbolType::EQL},
            {'#', SymbolType::NEQ},
            {'(', SymbolType::LPAREN},
            {')', SymbolType::RPAREN},
            {',', SymbolType::COMMA},
            {';', SymbolType::SEMICOLON},
            {'.', SymbolType::PERIOD}
    };
    static const std::unordered_map<char, State> startCharsStateMap = {
            {'<', State::LT},
            {'>', State::GT},
            {':', State::COLON}
    };

    std::string buffer;
    State state = State::START;
    while (stream.good())
    {
        if (state == State::START)
        {
            std::ws(stream);
            if (!stream.good())
                break;
            char c = stream.peek();
            if (std::isalpha(c))
            {
                buffer.push_back(stream.get());
                state = State::WORD;
            }
            else if (std::isdigit(c))
            {
                buffer.push_back(stream.get());
                state = State::NUM;
            }
            else if (startCharsSymbolTypeMap.find(c) != startCharsSymbolTypeMap.end())
            {
                stream.get();
                return Token(startCharsSymbolTypeMap.at(c), std::string(1, c));
            }
            else if (startCharsStateMap.find(c) != startCharsStateMap.end())
            {
                stream.get();
                state = startCharsStateMap.at(c);
            }
            else
                throw LexicalError(stream.tellg() + std::ios::pos_type(1));
        }
        else if (state == State::WORD)
        {
            char c = stream.peek();
            if (std::isalnum(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::NUM)
        {
            char c = stream.peek();
            if (std::isdigit(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::LT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::LEQ, "<=");
            }
            else
                break;
        }
        else if (state == State::GT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::GEQ, ">=");
            }
            else
                break;
        }
        else // if (state == State::COLON)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::BECOMES, ":=");
            }
            else
                break;
        }
    }
    if (state == State::WORD)
    {
        std::transform(buffer.begin(), buffer.end(), buffer.begin(), ::tolower);
        auto search = keywordsMap.find(buffer);
        if (search != keywordsMap.end())
            return Token(search->second, buffer);
        else
            return Token(SymbolType::IDENT, buffer);
    }
    else if (state == State::NUM)
        return Token(SymbolType::NUMBER, buffer);
    else if (state == State::LT)
        return Token(SymbolType::LSS, "<");
    else if (state == State::GT)
        return Token(SymbolType::GTR, ">");
    else if (state == State::COLON)
        throw LexicalError(stream.tellg());
    else
        return Token(SymbolType::NUL);
}